

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPSerializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BPSerializer::PutDimensionsRecord
          (BPSerializer *this,Dims *localDimensions,Dims *globalDimensions,Dims *offsets,
          vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  size_type sVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<char,_std::allocator<char>_> *in_R8;
  uint d_1;
  uint d;
  unsigned_long localDimension;
  const_iterator __end3;
  const_iterator __begin3;
  Dims *__range3;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  vector<char,_std::allocator<char>_> *pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff20;
  value_type_conflict3 *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<char,_std::allocator<char>_> *__n;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  vector<char,_std::allocator<char>_> *this_00;
  iterator in_stack_ffffffffffffff48;
  uint local_94;
  uint local_6c;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  vector<char,_std::allocator<char>_> *local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (in_stack_ffffffffffffff20);
  if ((bVar1) &&
     (bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        (in_stack_ffffffffffffff20), bVar1)) {
    local_30 = local_10;
    local_38._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff08);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffff10,
                              (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffff08), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_38);
      helper::InsertU64<unsigned_long>
                (in_stack_ffffffffffffff10,(unsigned_long)in_stack_ffffffffffffff08);
      std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff08);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                 in_stack_ffffffffffffff10,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                 in_stack_ffffffffffffff08);
      std::vector<char,_std::allocator<char>_>::insert
                (in_stack_ffffffffffffff40,(const_iterator)in_stack_ffffffffffffff48._M_current,
                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_38);
    }
  }
  else {
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (in_stack_ffffffffffffff20);
    if (bVar1) {
      for (local_6c = 0;
          sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10),
          local_6c < sVar2; local_6c = local_6c + 1) {
        pvVar3 = local_28;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (local_10,(ulong)local_6c);
        helper::InsertU64<unsigned_long>
                  (in_stack_ffffffffffffff10,(unsigned_long)in_stack_ffffffffffffff08);
        __n = local_28;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (local_18,(ulong)local_6c);
        helper::InsertU64<unsigned_long>
                  (in_stack_ffffffffffffff10,(unsigned_long)in_stack_ffffffffffffff08);
        this_00 = local_28;
        std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff08);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_ffffffffffffff10,
                   (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff48 =
             std::vector<char,_std::allocator<char>_>::insert
                       (this_00,in_stack_ffffffffffffff48._M_current,(size_type)__n,
                        (value_type_conflict3 *)pvVar3);
      }
    }
    else {
      for (local_94 = 0;
          sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10),
          local_94 < sVar2; local_94 = local_94 + 1) {
        pvVar3 = local_28;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (local_10,(ulong)local_94);
        helper::InsertU64<unsigned_long>(pvVar3,(unsigned_long)in_stack_ffffffffffffff08);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (local_18,(ulong)local_94);
        helper::InsertU64<unsigned_long>(pvVar3,(unsigned_long)in_stack_ffffffffffffff08);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (local_20,(ulong)local_94);
        helper::InsertU64<unsigned_long>(pvVar3,(unsigned_long)in_stack_ffffffffffffff08);
      }
    }
  }
  return;
}

Assistant:

void BPSerializer::PutDimensionsRecord(const Dims &localDimensions, const Dims &globalDimensions,
                                       const Dims &offsets, std::vector<char> &buffer) noexcept
{
    if (offsets.empty() && globalDimensions.empty())
    { // local array
        for (const auto localDimension : localDimensions)
        {
            helper::InsertU64(buffer, localDimension);
            buffer.insert(buffer.end(), 2 * sizeof(uint64_t), '\0');
        }
    }
    else if (offsets.empty())
    { // joined array has no offsets but has global dims
        for (unsigned int d = 0; d < localDimensions.size(); ++d)
        {
            helper::InsertU64(buffer, localDimensions[d]);
            helper::InsertU64(buffer, globalDimensions[d]);
            buffer.insert(buffer.end(), sizeof(uint64_t), '\0');
        }
    }
    else
    { // global array
        for (unsigned int d = 0; d < localDimensions.size(); ++d)
        {
            helper::InsertU64(buffer, localDimensions[d]);
            helper::InsertU64(buffer, globalDimensions[d]);
            helper::InsertU64(buffer, offsets[d]);
        }
    }
}